

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

void __thiscall GlobOpt::MarkArgumentsUsedForBranch(GlobOpt *this,Instr *instr)

{
  Opnd *this_00;
  Instr *pIVar1;
  bool bVar2;
  ArgSlot AVar3;
  BranchInstr *pBVar4;
  RegOpnd *pRVar5;
  SymOpnd *pSVar6;
  StackSym *pSVar7;
  Opnd *pOVar8;
  
  if (instr->m_kind != InstrKindBranch) {
    return;
  }
  pBVar4 = IR::Instr::AsBranchInstr(instr);
  bVar2 = IR::BranchInstr::IsUnconditional(pBVar4);
  if (bVar2) {
    return;
  }
  pBVar4 = IR::Instr::AsBranchInstr(instr);
  pOVar8 = (pBVar4->super_Instr).m_src1;
  this_00 = (pBVar4->super_Instr).m_src2;
  if (this_00 == (Opnd *)0x0) {
    if ((instr->m_opcode & ~ExtendedOpcodePrefix) != BrFalse_A) {
      return;
    }
    bVar2 = IR::Opnd::IsRegOpnd(pOVar8);
  }
  else {
    bVar2 = IR::Opnd::IsConstOpnd(this_00);
    if ((bVar2) && (bVar2 = IR::Opnd::IsRegOpnd(pOVar8), bVar2)) goto LAB_00420f77;
    bVar2 = IR::Opnd::IsRegOpnd(this_00);
    if (!bVar2) {
      return;
    }
    bVar2 = IR::Opnd::IsConstOpnd(pOVar8);
    pOVar8 = this_00;
  }
  if (bVar2 == false) {
    return;
  }
LAB_00420f77:
  pRVar5 = IR::Opnd::AsRegOpnd(pOVar8);
  if ((((pRVar5 != (RegOpnd *)0x0) &&
       (pIVar1 = (pRVar5->m_sym->field_5).m_instrDef,
       (pIVar1 != (Instr *)0x0 & pRVar5->m_sym->field_0x18) == 1)) &&
      (pOVar8 = pIVar1->m_src1, pOVar8 != (Opnd *)0x0)) &&
     ((bVar2 = IR::Opnd::IsSymOpnd(pOVar8), bVar2 &&
      (pSVar6 = IR::Opnd::AsSymOpnd(pOVar8), pSVar6->m_sym->m_kind == SymKindStack)))) {
    pSVar6 = IR::Opnd::AsSymOpnd(pOVar8);
    pSVar7 = Sym::AsStackSym(pSVar6->m_sym);
    if ((pSVar7->field_0x1a & 0x40) != 0) {
      pSVar6 = IR::Opnd::AsSymOpnd(pOVar8);
      pSVar7 = Sym::AsStackSym(pSVar6->m_sym);
      AVar3 = StackSym::GetParamSlotNum(pSVar7);
      if (AVar3 < 0xd) {
        JITOutput::SetArgUsedForBranch(&this->func->m_output,(uint8)AVar3);
        return;
      }
    }
  }
  return;
}

Assistant:

void
GlobOpt::MarkArgumentsUsedForBranch(IR::Instr * instr)
{
    // If it's a conditional branch instruction and the operand used for branching is one of the arguments
    // to the function, tag the m_argUsedForBranch of the functionBody so that it can be used later for inlining decisions.
    if (instr->IsBranchInstr() && !instr->AsBranchInstr()->IsUnconditional())
    {
        IR::BranchInstr * bInstr = instr->AsBranchInstr();
        IR::Opnd *src1 = bInstr->GetSrc1();
        IR::Opnd *src2 = bInstr->GetSrc2();
        // These are used because we don't want to rely on src1 or src2 to always be the register/constant
        IR::RegOpnd *regOpnd = nullptr;
        if (!src2 && (instr->m_opcode == Js::OpCode::BrFalse_A || instr->m_opcode == Js::OpCode::BrTrue_A) && src1->IsRegOpnd())
        {
            regOpnd = src1->AsRegOpnd();
        }
        // We need to check for (0===arg) and (arg===0); this is especially important since some minifiers
        // change all instances of one to the other.
        else if (src2 && src2->IsConstOpnd() && src1->IsRegOpnd())
        {
            regOpnd = src1->AsRegOpnd();
        }
        else if (src2 && src2->IsRegOpnd() && src1->IsConstOpnd())
        {
            regOpnd = src2->AsRegOpnd();
        }
        if (regOpnd != nullptr)
        {
            if (regOpnd->m_sym->IsSingleDef())
            {
                IR::Instr * defInst = regOpnd->m_sym->GetInstrDef();
                IR::Opnd *defSym = defInst->GetSrc1();
                if (defSym && defSym->IsSymOpnd() && defSym->AsSymOpnd()->m_sym->IsStackSym()
                    && defSym->AsSymOpnd()->m_sym->AsStackSym()->IsParamSlotSym())
                {
                    uint16 param = defSym->AsSymOpnd()->m_sym->AsStackSym()->GetParamSlotNum();

                    // We only support functions with 13 arguments to ensure optimal size of callSiteInfo
                    if (param < Js::Constants::MaximumArgumentCountForConstantArgumentInlining)
                    {
                        this->func->GetJITOutput()->SetArgUsedForBranch((uint8)param);
                    }
                }
            }
        }
    }
}